

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall pstore::storage::protect(storage *this,address first,address last)

{
  _Head_base<0UL,_pstore::region::factory_*,_false> _Var1;
  factory *pfVar2;
  bool bVar3;
  type ps;
  uint64_t uVar4;
  address *paVar5;
  element_type *peVar6;
  unsigned_long *puVar7;
  uint64_t uVar8;
  __uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_> *p_Var9;
  factory *pfVar10;
  shared_ptr<void> *__b;
  element_type *peVar11;
  shared_ptr<unsigned_char> pfirst;
  _Head_base<0UL,_pstore::system_page_size_interface_*,_false> local_90;
  _Head_base<0UL,_pstore::region::factory_*,_false> local_88;
  uint64_t last_offset;
  pointer local_78;
  _Head_base<0UL,_pstore::region::factory_*,_false> local_70;
  uint64_t first_offset;
  shared_ptr<pstore::memory_mapper_base> *region;
  reverse_iterator region_it;
  reverse_iterator end;
  address local_40;
  value_type local_38;
  address local_30;
  uint64_t local_28;
  uint64_t page_size;
  storage *this_local;
  address last_local;
  address first_local;
  
  page_size = (uint64_t)this;
  this_local = (storage *)last.a_;
  last_local = first;
  ps = std::
       unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
       ::operator*(&this->page_size_);
  local_28 = memory_mapper_base::page_size(ps);
  if ((local_28 == 0) ||
     (bVar3 = is_power_of_two<unsigned_long,std::enable_if<true,void>>(local_28), !bVar3)) {
    assert_failed("page_size > 0 && is_power_of_two (page_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                  ,0xbf);
  }
  local_38 = last_local.a_;
  local_30 = anon_unknown.dwarf_15f937::round_down(last_local,local_28);
  uVar4 = anon_unknown.dwarf_15f937::round_down(local_28 + 0x3f,local_28);
  address::address(&local_40,uVar4);
  paVar5 = std::max<pstore::address>(&local_30,&local_40);
  last_local.a_ = paVar5->a_;
  this_local = (storage *)anon_unknown.dwarf_15f937::round_down((address)this_local,local_28);
  std::
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  ::rend((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
          *)&region_it);
  std::
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  ::rbegin((vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
            *)&region);
  do {
    bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>_>
                             *)&region,&region_it);
    if (!bVar3) {
      return;
    }
    first_offset = (uint64_t)
                   std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>_>
                                *)&region);
    peVar6 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)first_offset);
    uVar4 = memory_mapper_base::offset(peVar6);
    if (uVar4 % local_28 != 0) {
      assert_failed("region->offset () % page_size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0xc9);
    }
    peVar6 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)first_offset);
    local_78 = (pointer)memory_mapper_base::offset(peVar6);
    last_offset = address::absolute(&last_local);
    puVar7 = std::max<unsigned_long>((unsigned_long *)&stack0xffffffffffffff88,&last_offset);
    local_70._M_head_impl = (factory *)*puVar7;
    peVar6 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)first_offset);
    uVar4 = memory_mapper_base::offset(peVar6);
    peVar6 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)first_offset);
    uVar8 = memory_mapper_base::size(peVar6);
    local_90._M_head_impl = (system_page_size_interface *)(uVar4 + uVar8);
    pfirst.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)address::absolute((address *)&this_local);
    p_Var9 = (__uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
              *)std::min<unsigned_long>
                          ((unsigned_long *)&stack0xffffffffffffff70,
                           (unsigned_long *)
                           &pfirst.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    local_88._M_head_impl = *(factory **)&p_Var9->_M_t;
    peVar6 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)first_offset);
    uVar4 = memory_mapper_base::offset(peVar6);
    peVar6 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)first_offset);
    uVar8 = memory_mapper_base::size(peVar6);
    pfVar2 = local_70._M_head_impl;
    if ((factory *)(uVar4 + uVar8) < local_70._M_head_impl) {
      return;
    }
    pfVar10 = (factory *)address::absolute(&last_local);
    if ((pfVar10 <= pfVar2) && (local_70._M_head_impl < local_88._M_head_impl)) {
      typed_address<unsigned_char>::make((value_type)local_70._M_head_impl);
      address_to_pointer<unsigned_char>
                ((storage *)&stack0xffffffffffffff58,(typed_address<unsigned_char>)this);
      peVar6 = std::
               __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)first_offset);
      __b = memory_mapper_base::data(peVar6);
      bVar3 = std::operator>=((shared_ptr<unsigned_char> *)&stack0xffffffffffffff58,__b);
      _Var1._M_head_impl = local_88._M_head_impl;
      if (!bVar3) {
        assert_failed("pfirst >= region->data ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                      ,0xd6);
      }
      peVar6 = std::
               __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)first_offset);
      uVar4 = memory_mapper_base::offset(peVar6);
      peVar6 = std::
               __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)first_offset);
      uVar8 = memory_mapper_base::size(peVar6);
      if (uVar8 < (long)_Var1._M_head_impl - uVar4) {
        assert_failed("last_offset - region->offset () <= region->size ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                      ,0xd7);
      }
      peVar6 = std::
               __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)first_offset);
      peVar11 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)
                           &stack0xffffffffffffff58);
      (*peVar6->_vptr_memory_mapper_base[2])
                (peVar6,peVar11,(long)local_88._M_head_impl - (long)local_70._M_head_impl);
      std::shared_ptr<unsigned_char>::~shared_ptr
                ((shared_ptr<unsigned_char> *)&stack0xffffffffffffff58);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>_>
                  *)&region);
  } while( true );
}

Assistant:

void storage::protect (address first, address last) {
        std::uint64_t const page_size = memory_mapper::page_size (*page_size_);
        PSTORE_ASSERT (page_size > 0 && is_power_of_two (page_size));

        first = std::max (round_down (first, page_size),
                          address{round_down (leader_size + page_size - 1U, page_size)});
        last = round_down (last, page_size);

        auto const end = regions_.rend ();
        for (auto region_it = regions_.rbegin (); region_it != end; ++region_it) {
            std::shared_ptr<memory_mapper_base> & region = *region_it;

            PSTORE_ASSERT (region->offset () % page_size == 0);
            std::uint64_t const first_offset = std::max (region->offset (), first.absolute ());
            std::uint64_t const last_offset =
                std::min (region->offset () + region->size (), last.absolute ());

            if (region->offset () + region->size () < first_offset) {
                break;
            }

            if (first_offset >= first.absolute () && last_offset > first_offset) {
                auto const pfirst =
                    this->address_to_pointer (typed_address<std::uint8_t>::make (first_offset));

                PSTORE_ASSERT (pfirst >= region->data ());
                PSTORE_ASSERT (last_offset - region->offset () <= region->size ());

                region->read_only (pfirst.get (), last_offset - first_offset);
            }
        }
    }